

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
::basic_json(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
             *this,initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>
                   init,bool type_deduction,value_t manual_type)

{
  pointer *ppbVar1;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  bool bVar2;
  bool bVar3;
  ushort uVar4;
  size_type sVar5;
  const_reference pvVar6;
  array_t *paVar7;
  object_t *poVar8;
  domain_error *this_01;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  *this_02;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  *element;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  *element_1;
  iterator this_03;
  long lVar9;
  bool bVar10;
  initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>
  local_40;
  
  local_40._M_len = init._M_len;
  this_02 = init._M_array;
  (this->m_type).data = 0;
  (this->m_value).object = (object_t *)0x0;
  local_40._M_array = this_02;
  if (local_40._M_len == 0) {
    bVar3 = true;
    bVar2 = true;
  }
  else {
    lVar9 = local_40._M_len * 0x10;
    bVar3 = true;
    bVar2 = true;
    do {
      lVar9 = lVar9 + -0x10;
      if ((((this_02->m_type).data & 0xf) == 2) && (sVar5 = size(this_02), sVar5 == 2)) {
        pvVar6 = operator[](this_02,0);
        bVar10 = ((pvVar6->m_type).data & 0xf) != 3;
        if (bVar10) {
          bVar3 = false;
          bVar2 = false;
        }
      }
      else {
        bVar3 = false;
        bVar2 = false;
        bVar10 = true;
      }
    } while ((!bVar10) && (this_02 = this_02 + 1, lVar9 != 0));
  }
  if (!type_deduction) {
    bVar2 = bVar3;
    if (manual_type == array) {
      bVar2 = false;
    }
    if ((manual_type == object) && (!bVar2)) {
      this_01 = (domain_error *)__cxa_allocate_exception(0x10);
      std::domain_error::domain_error(this_01,"cannot create object from initializer list");
      __cxa_throw(this_01,&std::domain_error::typeinfo,std::domain_error::~domain_error);
    }
  }
  uVar4 = (this->m_type).data & 0xfff0;
  if (bVar2) {
    (this->m_type).data = uVar4 | 1;
    paVar7 = (array_t *)operator_new(0x30);
    ppbVar1 = &(paVar7->
               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    (paVar7->
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar7[1].
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    paVar7[1].
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    paVar7[1].
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (paVar7->
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (paVar7->
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    paVar7[1].
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
    paVar7[1].
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)ppbVar1;
    paVar7[1].
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->m_value).array = paVar7;
    if (local_40._M_len != 0) {
      lVar9 = local_40._M_len << 4;
      this_03 = local_40._M_array;
      do {
        this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>>
                   *)(this->m_value).object;
        pvVar6 = operator[](this_03,0);
        __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (pvVar6->m_value).object;
        pvVar6 = operator[](this_03,1);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>>
        ::
        _M_emplace_unique<std::__cxx11::string&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>const&>
                  (this_00,__args,pvVar6);
        this_03 = this_03 + 1;
        lVar9 = lVar9 + -0x10;
      } while (lVar9 != 0);
    }
  }
  else {
    (this->m_type).data = uVar4 | 2;
    poVar8 = (object_t *)
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
             ::
             create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>,std::initializer_list<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>&>
                       (&local_40);
    (this->m_value).object = poVar8;
  }
  return;
}

Assistant:

basic_json(std::initializer_list<basic_json> init,
                   bool type_deduction = true,
                   value_t manual_type = value_t::array)
        {
            // the initializer list could describe an object
            bool is_an_object = true;

            // check if each element is an array with two elements whose first
            // element is a string
            for (const auto& element : init)
            {
                if (not element.is_array() or element.size() != 2
                    or not element[0].is_string())
                {
                    // we found an element that makes it impossible to use the
                    // initializer list as object
                    is_an_object = false;
                    break;
                }
            }

            // adjust type if type deduction is not wanted
            if (not type_deduction)
            {
                // if array is wanted, do not create an object though possible
                if (manual_type == value_t::array)
                {
                    is_an_object = false;
                }

                // if object is wanted but impossible, throw an exception
                if (manual_type == value_t::object and not is_an_object)
                {
                    throw std::domain_error("cannot create object from initializer list");
                }
            }

            if (is_an_object)
            {
                // the initializer list is a list of pairs -> create object
                m_type = value_t::object;
                m_value = value_t::object;

                assert(m_value.object != nullptr);

                for (auto& element : init)
                {
                    m_value.object->emplace(*(element[0].m_value.string), element[1]);
                }
            }
            else
            {
                // the initializer list describes an array -> create array
                m_type = value_t::array;
                m_value.array = create<array_t>(init);
            }
        }